

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O3

_Bool square_isarrivable(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  square *psVar2;
  trap_kind_conflict *ptVar3;
  
  psVar2 = square(c,grid);
  if ((psVar2->mon == 0) && (_Var1 = square_trap_flag((chunk *)c,grid,L'\x02'), !_Var1)) {
    ptVar3 = lookup_trap("web");
    _Var1 = square_trap_specific((chunk *)c,grid,ptVar3->tidx);
    if (!_Var1) {
      psVar2 = square(c,grid);
      _Var1 = flag_has_dbg(f_info[psVar2->feat].flags,4,0xf,"f_info[feat].flags","TF_FLOOR");
      if (_Var1) {
        return true;
      }
      psVar2 = square(c,grid);
      _Var1 = flag_has_dbg(f_info[psVar2->feat].flags,4,0x1a,"f_info[feat].flags","TF_STAIR");
      return _Var1;
    }
  }
  return false;
}

Assistant:

bool square_isarrivable(struct chunk *c, struct loc grid) {
	if (square(c, grid)->mon) return false;
	if (square_isplayertrap(c, grid)) return false;
	if (square_iswebbed(c, grid)) return false;
	if (square_isfloor(c, grid)) return true;
	if (square_isstairs(c, grid)) return true;
	// maybe allow open doors or suchlike?
	return false;
}